

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

Operator *
Operator::binary(Operator *__return_storage_ptr__,OperatorChar op,int precedence,
                OperatorAssociativity associativity,BinaryOperatorFn *applyFn)

{
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  function<ResultValue_(ResultValue,_ResultValue)> local_40;
  
  std::function<ResultValue_(ResultValue,_ResultValue)>::function(&local_40,applyFn);
  local_58 = 0;
  uStack_50 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  Operator(__return_storage_ptr__,op,precedence,associativity,false,&local_40,
           (UnaryOperatorFn *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

Operator Operator::binary(OperatorChar op, int precedence, OperatorAssociativity associativity, BinaryOperatorFn applyFn) {
	return Operator(op, precedence, associativity, false, applyFn, {});
}